

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mfcc.hpp
# Opt level: O2

Mat_<double> *
mel_spectrogram_create(Mat_<double> *__return_storage_ptr__,int nps,int n_fft,int n_mels)

{
  long *plVar1;
  int j_3;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  int j;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  uint _cols;
  bool bVar8;
  double max_;
  undefined8 local_868;
  _OutputArray local_860;
  _InputArray local_848;
  Mat_<double> mel_f;
  Mat_<double> ramps;
  Mat_<double> fftfreqs;
  _InputArray local_710 [4];
  Mat_<double> lower;
  Mat_<double> ramps_2;
  Mat_<double> ramps_1;
  Mat_<double> fdiff;
  Mat_<double> enorm;
  Mat weights_1;
  long local_3c0;
  Mat c2;
  Mat_<double> d2;
  Mat_<double> d1;
  Mat_<double> local_250;
  Mat_<double> mels;
  Mat_<double> upper;
  
  _cols = n_fft / 2 + 1;
  enorm.super_Mat = (Mat)0x0;
  enorm._1_7_ = 0;
  cv::Mat_<double>::Mat_(__return_storage_ptr__,n_mels,_cols,(double *)&enorm);
  cvlinspace(&fftfreqs,0.0,(double)nps * 0.5,_cols);
  max_ = hz_to_mel((double)nps * 0.5,false);
  cvlinspace(&mels,0.0,max_,n_mels + 2);
  cv::Mat::Mat(&local_250.super_Mat,&mels.super_Mat);
  mel_to_hz(&mel_f,&local_250,false);
  cv::Mat::~Mat(&local_250.super_Mat);
  cv::Mat_<double>::Mat_(&d1,1,mel_f._8_4_ * mel_f._12_4_ + -1,(double *)(mel_f._16_8_ + 8),0);
  cv::Mat_<double>::Mat_(&d2,1,mel_f._8_4_ * mel_f._12_4_ + -1,(double *)mel_f._16_8_,0);
  cv::operator-(&enorm.super_Mat,&d1.super_Mat);
  cv::Mat_<double>::Mat_(&fdiff,(MatExpr *)&enorm);
  cv::MatExpr::~MatExpr((MatExpr *)&enorm);
  cv::Mat_<double>::Mat_(&ramps,mel_f._12_4_,fftfreqs._12_4_);
  uVar2 = 0;
  uVar6 = (ulong)(uint)fftfreqs._12_4_;
  if ((int)fftfreqs._12_4_ < 1) {
    uVar6 = uVar2;
  }
  uVar3 = (ulong)(uint)mel_f._12_4_;
  if ((int)mel_f._12_4_ < 1) {
    uVar3 = uVar2;
  }
  for (; uVar2 != uVar3; uVar2 = uVar2 + 1) {
    for (uVar5 = 0; uVar6 != uVar5; uVar5 = uVar5 + 1) {
      *(double *)(*(long *)ramps._72_8_ * uVar2 + ramps._16_8_ + uVar5 * 8) =
           *(double *)(mel_f._16_8_ + uVar2 * 8) - *(double *)(fftfreqs._16_8_ + uVar5 * 8);
    }
  }
  if ((int)_cols < 1) {
    _cols = 0;
  }
  uVar6 = 0;
  if (0 < n_mels) {
    uVar6 = (ulong)(uint)n_mels;
  }
  lVar7 = 2;
  uVar2 = 0;
  while (uVar2 != uVar6) {
    cv::Mat_<double>::Mat_(&ramps_1,1,ramps._12_4_);
    uVar3 = 0;
    if (0 < (int)ramps._12_4_) {
      uVar3 = (ulong)(uint)ramps._12_4_;
    }
    for (uVar5 = 0; uVar3 != uVar5; uVar5 = uVar5 + 1) {
      *(undefined8 *)(ramps_1._16_8_ + uVar5 * 8) =
           *(undefined8 *)(*(long *)ramps._72_8_ * uVar2 + ramps._16_8_ + uVar5 * 8);
    }
    cv::Mat_<double>::Mat_(&ramps_2,1,ramps._12_4_);
    uVar3 = (ulong)(uint)ramps._12_4_;
    if ((int)ramps._12_4_ < 1) {
      uVar3 = 0;
    }
    for (uVar5 = 0; uVar3 != uVar5; uVar5 = uVar5 + 1) {
      *(undefined8 *)(ramps_2._16_8_ + uVar5 * 8) =
           *(undefined8 *)(*(long *)ramps._72_8_ * lVar7 + ramps._16_8_ + uVar5 * 8);
    }
    cv::operator*(&upper.super_Mat,-1.0);
    cv::operator/((MatExpr *)&enorm,*(double *)(fdiff._16_8_ + uVar2 * 8));
    cv::Mat_<double>::Mat_(&lower,(MatExpr *)&enorm);
    cv::MatExpr::~MatExpr((MatExpr *)&enorm);
    cv::MatExpr::~MatExpr((MatExpr *)&upper.super_Mat);
    cv::operator/((Mat *)&enorm,*(double *)(fdiff._16_8_ + 8 + uVar2 * 8));
    cv::Mat_<double>::Mat_((Mat_<double> *)&upper.super_Mat,(MatExpr *)&enorm);
    cv::MatExpr::~MatExpr((MatExpr *)&enorm);
    cv::Mat::Mat((Mat *)&enorm,&lower.super_Mat);
    cv::Mat::Mat(&c2,&upper.super_Mat);
    cv::Mat_<double>::Mat_((Mat_<double> *)local_710,1,lower._12_4_);
    cv::Mat::Mat(&weights_1,(Mat *)local_710);
    cv::Mat::~Mat((Mat *)local_710);
    cv::min(&enorm.super_Mat,&c2,&weights_1);
    local_710[0].sz.width = 0;
    local_710[0].sz.height = 0;
    local_710[0].flags = 0x1010000;
    local_868 = 0;
    local_848.flags = -0x3efdfffa;
    local_860.super__InputArray.sz.width = 0;
    local_860.super__InputArray.sz.height = 0;
    local_848.obj = &local_868;
    local_848.sz.width = 1;
    local_848.sz.height = 1;
    local_860.super__InputArray.flags = 0x2010000;
    local_860.super__InputArray.obj = &weights_1;
    local_710[0].obj = &weights_1;
    cv::max(local_710,&local_848,&local_860);
    lVar4 = *(long *)&__return_storage_ptr__->field_0x10;
    plVar1 = *(long **)&__return_storage_ptr__->field_0x48;
    for (uVar3 = 0; _cols != uVar3; uVar3 = uVar3 + 1) {
      *(undefined8 *)(*plVar1 * uVar2 + lVar4 + uVar3 * 8) = *(undefined8 *)(local_3c0 + uVar3 * 8);
    }
    cv::Mat::~Mat(&weights_1);
    cv::Mat::~Mat(&c2);
    cv::Mat::~Mat(&enorm.super_Mat);
    cv::Mat::~Mat(&upper.super_Mat);
    cv::Mat::~Mat(&lower.super_Mat);
    cv::Mat::~Mat(&ramps_2.super_Mat);
    cv::Mat::~Mat(&ramps_1.super_Mat);
    lVar7 = lVar7 + 1;
    uVar2 = uVar2 + 1;
  }
  cv::Mat_<double>::Mat_(&enorm,1,n_mels);
  for (uVar2 = 0; uVar6 != uVar2; uVar2 = uVar2 + 1) {
    *(double *)(enorm._16_8_ + uVar2 * 8) =
         2.0 / (*(double *)(mel_f._16_8_ + 0x10 + uVar2 * 8) - *(double *)(mel_f._16_8_ + uVar2 * 8)
               );
  }
  for (uVar2 = 0; uVar2 != uVar6; uVar2 = uVar2 + 1) {
    lVar7 = *(long *)&__return_storage_ptr__->field_0x10;
    plVar1 = *(long **)&__return_storage_ptr__->field_0x48;
    uVar3 = (ulong)_cols;
    while (bVar8 = uVar3 != 0, uVar3 = uVar3 - 1, bVar8) {
      lVar4 = *plVar1 * uVar2;
      *(double *)(lVar7 + lVar4) =
           *(double *)(enorm._16_8_ + uVar2 * 8) * *(double *)(lVar7 + lVar4);
      lVar7 = lVar7 + 8;
    }
  }
  cv::Mat::~Mat(&enorm.super_Mat);
  cv::Mat::~Mat(&ramps.super_Mat);
  cv::Mat::~Mat(&fdiff.super_Mat);
  cv::Mat::~Mat(&d2.super_Mat);
  cv::Mat::~Mat(&d1.super_Mat);
  cv::Mat::~Mat(&mel_f.super_Mat);
  cv::Mat::~Mat(&mels.super_Mat);
  cv::Mat::~Mat(&fftfreqs.super_Mat);
  return __return_storage_ptr__;
}

Assistant:

cv::Mat_<double> mel_spectrogram_create(int nps, int n_fft, int n_mels) {
    double f_max = nps / 2.0;
    double f_min = 0;
    int n_fft_2 = 1 + n_fft / 2;
    // Initialize the weights
    //auto weights = nc::zeros<double>(nc::uint32(n_mels), nc::uint32(n_fft_2));
    auto weights = cv::Mat_<double>(n_mels, n_fft_2, 0.0);
    // Center freqs of each FFT bin
    //auto fftfreqs_ = nc::linspace<double>(f_min, f_max, nc::uint32(n_fft_2), true);
    auto fftfreqs = cvlinspace(f_min, f_max, n_fft_2);

    // 'Center freqs' of mel bands - uniformly spaced between limits
    double min_mel = hz_to_mel(f_min, false);
    double max_mel = hz_to_mel(f_max, false);
    //auto mels_ = nc::linspace(min_mel, max_mel, nc::uint32(n_mels + 2));
    auto mels = cvlinspace(min_mel, max_mel, n_mels + 2);
    auto mel_f = mel_to_hz(mels, false);

    //auto fdiff_ = nc::diff(mel_f_); //沿着指定轴计算第N维的离散差值(后一个元素减去前一个元素)
    cv::Mat_<double> d1(1, mel_f.cols * mel_f.rows - 1, (double *) (mel_f.data) + 1);
    cv::Mat_<double> d2(1, mel_f.cols * mel_f.rows - 1, (double *) (mel_f.data));
    cv::Mat_<double> fdiff = d1 - d2;

    //auto ramps = nc::subtract.outer(mel_f, fftfreqs); //nc没有subtract.outer
    //nc::NdArray<double> ramps = nc::zeros<double>(mel_f.cols, fftfreqs.cols);
    auto ramps = cv::Mat_<double>(mel_f.cols, fftfreqs.cols);
    for (int i = 0; i < mel_f.cols; i++) {
        for (int j = 0; j < fftfreqs.cols; j++) {
            ramps(i, j) = mel_f(0, i) - fftfreqs(0, j);
        }
    }

    for (int i = 0; i < n_mels; i++) {
        // lower and upper slopes for all bins
        //auto ramps_1 = nc::NdArray<double>(1, ramps.cols);
        auto ramps_1 = cv::Mat_<double>(1, ramps.cols);
        for (int j = 0; j < ramps.cols; j++) {
            ramps_1(0, j) = ramps(i, j);
        }
        //auto ramps_2 = nc::NdArray<double>(1, ramps.cols);
        auto ramps_2 = cv::Mat_<double>(1, ramps.cols);
        for (int j = 0; j < ramps.cols; j++) {
            ramps_2(0, j) = ramps(i + 2, j);
        }
        cv::Mat_<double> lower = ramps_1 * -1 / fdiff(0, i);
        cv::Mat_<double> upper = ramps_2 / fdiff(0, i + 1);
        // .. then intersect them with each other and zero
        //auto weights_1 = nc::maximum(nc::zeros<double>(1, ramps.cols), nc::minimum(lower, upper));
        cv::Mat c1 = lower;//(cv::Mat_<double>(1,5) << 1,2,-3,4,-5);
        cv::Mat c2 = upper;
        cv::Mat weights_1 = cv::Mat_<double>(1, lower.cols);
        cv::min(c1, c2, weights_1);
        cv::max(weights_1, 0, weights_1);
        for (int j = 0; j < n_fft_2; j++) {
            weights(i, j) = weights_1.at<double_t>(0, j);
        }
    }

    // Slaney-style mel is scaled to be approx constant energy per channel
    auto enorm = cv::Mat_<double>(1, n_mels);
    for (int j = 0; j < n_mels; j++) {
        enorm(0, j) = 2.0 / (mel_f(0, j + 2) - mel_f(0, j));
    }
    for (int j = 0; j < n_mels; j++) {
        for (int k = 0; k < n_fft_2; k++) {
            weights(j, k) *= enorm(0, j);
        }
    }
    return weights;
}